

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  stbi__uint16 *psVar5;
  uint uVar6;
  ushort *puVar7;
  ushort *puVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  stbi__uint16 *psVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  
  psVar5 = data;
  if (req_comp != img_n) {
    psVar5 = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (psVar5 == (stbi__uint16 *)0x0) {
      free(data);
      stbi__g_failure_reason = "outofmem";
      psVar5 = (stbi__uint16 *)0x0;
    }
    else {
      if (0 < (int)y) {
        iVar4 = req_comp + img_n * 8;
        iVar1 = x - 1;
        uVar9 = 0;
        auVar15[8] = 0xff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15[9] = 0xff;
        auVar15[10] = 0xff;
        auVar15[0xb] = 0xff;
        auVar15[0xc] = 0xff;
        auVar15[0xd] = 0xff;
        auVar15[0xe] = 0xff;
        auVar15[0xf] = 0xff;
        uVar13 = 0;
        uVar14 = 0;
        do {
          if (iVar4 - 10U < 0x1a) {
            iVar10 = (int)uVar14 * x;
            puVar8 = data + (uint)(iVar10 * img_n);
            psVar12 = psVar5 + (uint)(iVar10 * req_comp);
            switch(iVar4) {
            case 10:
              if (-1 < iVar1) {
                lVar11 = 0;
                uVar6 = x;
                do {
                  psVar5[uVar13 + lVar11] = *(stbi__uint16 *)((long)data + lVar11 + uVar9 * 2);
                  psVar5[uVar13 + lVar11 + 1] = 0xffff;
                  uVar6 = uVar6 - 1;
                  lVar11 = lVar11 + 2;
                } while (0 < (int)uVar6);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                puVar7 = psVar5 + uVar13 + 2;
                uVar6 = x;
                do {
                  uVar2 = *puVar8;
                  *puVar7 = uVar2;
                  puVar7[-1] = uVar2;
                  puVar7[-2] = uVar2;
                  puVar8 = puVar8 + 1;
                  uVar6 = uVar6 - 1;
                  puVar7 = puVar7 + 3;
                } while (0 < (int)uVar6);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar11 = 0;
                uVar6 = x;
                do {
                  auVar3 = vpinsrw_avx(auVar15,(uint)*(ushort *)((long)data + lVar11 + uVar9 * 2),0)
                  ;
                  auVar3 = vpshuflw_avx(auVar3,0x40);
                  *(long *)(psVar5 + uVar13 + lVar11 * 2) = auVar3._0_8_;
                  uVar6 = uVar6 - 1;
                  lVar11 = lVar11 + 2;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x11:
              if (-1 < iVar1) {
                lVar11 = 0;
                uVar6 = x;
                do {
                  *(stbi__uint16 *)((long)psVar5 + lVar11 + uVar13 * 2) = data[uVar9 + lVar11];
                  uVar6 = uVar6 - 1;
                  lVar11 = lVar11 + 2;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                puVar7 = psVar5 + uVar13 + 2;
                uVar6 = x;
                do {
                  uVar2 = *puVar8;
                  *puVar7 = uVar2;
                  puVar7[-1] = uVar2;
                  puVar7[-2] = uVar2;
                  puVar8 = puVar8 + 2;
                  uVar6 = uVar6 - 1;
                  puVar7 = puVar7 + 3;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar11 = 0;
                uVar6 = x;
                do {
                  auVar3 = vpshuflw_avx(ZEXT416(*(uint *)((long)data + lVar11 + uVar9 * 2)),0x40);
                  *(long *)(psVar5 + uVar13 + lVar11) = auVar3._0_8_;
                  uVar6 = uVar6 - 1;
                  lVar11 = lVar11 + 4;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x19:
              uVar6 = x;
              if (-1 < iVar1) {
                do {
                  uVar2 = puVar8[2];
                  *psVar12 = (stbi__uint16)
                             ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                              (uint)puVar8[1] * 0x96 + (uint)*puVar8 * 0x4d >> 8);
                  puVar8 = puVar8 + 3;
                  psVar12 = psVar12 + 1;
                  uVar6 = uVar6 - 1;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x1a:
              uVar6 = x;
              if (-1 < iVar1) {
                do {
                  uVar2 = puVar8[2];
                  *psVar12 = (stbi__uint16)
                             ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                              (uint)puVar8[1] * 0x96 + (uint)*puVar8 * 0x4d >> 8);
                  psVar12[1] = 0xffff;
                  puVar8 = puVar8 + 3;
                  psVar12 = psVar12 + 2;
                  uVar6 = uVar6 - 1;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x1c:
              uVar6 = x;
              if (-1 < iVar1) {
                do {
                  *(undefined4 *)psVar12 = *(undefined4 *)puVar8;
                  psVar12[2] = puVar8[2];
                  psVar12[3] = 0xffff;
                  puVar8 = puVar8 + 3;
                  psVar12 = psVar12 + 4;
                  uVar6 = uVar6 - 1;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar11 = 0;
                uVar6 = x;
                do {
                  uVar2 = data[uVar9 + lVar11 * 2 + 2];
                  *(short *)((long)psVar5 + lVar11 + uVar13 * 2) =
                       (short)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                               (uint)data[uVar9 + lVar11 * 2 + 1] * 0x96 +
                               (uint)data[uVar9 + lVar11 * 2] * 0x4d >> 8);
                  uVar6 = uVar6 - 1;
                  lVar11 = lVar11 + 2;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar11 = 0;
                uVar6 = x;
                do {
                  uVar2 = data[uVar9 + lVar11 + 2];
                  *(short *)((long)psVar5 + lVar11 + uVar13 * 2) =
                       (short)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                               (uint)data[uVar9 + lVar11 + 1] * 0x96 +
                               (uint)data[uVar9 + lVar11] * 0x4d >> 8);
                  *(stbi__uint16 *)((long)psVar5 + lVar11 + uVar13 * 2 + 2) =
                       data[uVar9 + lVar11 + 3];
                  uVar6 = uVar6 - 1;
                  lVar11 = lVar11 + 4;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x23:
              uVar6 = x;
              if (-1 < iVar1) {
                do {
                  *(undefined4 *)psVar12 = *(undefined4 *)puVar8;
                  psVar12[2] = puVar8[2];
                  puVar8 = puVar8 + 4;
                  psVar12 = psVar12 + 3;
                  uVar6 = uVar6 - 1;
                } while (0 < (int)uVar6);
              }
            }
          }
          uVar14 = uVar14 + 1;
          uVar13 = (ulong)((int)uVar13 + req_comp * x);
          uVar9 = (ulong)((int)uVar9 + x * img_n);
        } while (uVar14 != y);
      }
      free(data);
    }
  }
  return psVar5;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}